

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::SetDebugObjectDebugModeAccessor
          (JavascriptLibrary *this,FunctionInfo *funcGetter)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptFunction *pJVar4;
  Var pvVar5;
  FunctionInfo *funcGetter_local;
  JavascriptLibrary *this_local;
  
  if (funcGetter == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x75d,"(funcGetter)","funcGetter");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pJVar4 = CreateNonProfiledFunction(this,funcGetter);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
            (&(this->super_JavascriptLibraryBase).debugObjectDebugModeGetterFunction,pJVar4);
  pJVar4 = Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator->
                     (&(this->super_JavascriptLibraryBase).debugObjectDebugModeGetterFunction);
  pvVar5 = TaggedInt::ToVarUnchecked(0);
  (*(pJVar4->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])(pJVar4,0xd1,pvVar5,2,0,0,0xf);
  return;
}

Assistant:

void JavascriptLibrary::SetDebugObjectDebugModeAccessor(FunctionInfo *funcGetter)
    {
        Assert(funcGetter);

        debugObjectDebugModeGetterFunction = CreateNonProfiledFunction(funcGetter);
        debugObjectDebugModeGetterFunction->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable, nullptr);
    }